

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O2

void sx_coro_destroy_context(sx_coro_context *ctx)

{
  int iVar1;
  sx_pool *psVar2;
  sx_alloc *psVar3;
  sx__pool_page *psVar4;
  code *pcVar5;
  sx__pool_page *psVar6;
  long lVar7;
  sx__pool_page **ppsVar8;
  
  if (ctx == (sx_coro_context *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                      0xc2,"ctx");
    pcVar5 = (code *)swi(3);
    (*pcVar5)();
    return;
  }
  psVar2 = ctx->coro_pool;
  if (psVar2 != (sx_pool *)0x0) {
    psVar3 = ctx->alloc;
    iVar1 = psVar2->capacity;
    ppsVar8 = &psVar2->pages;
    while (psVar6 = *ppsVar8, psVar6 != (sx__pool_page *)0x0) {
      for (lVar7 = (long)psVar6->iter; lVar7 < iVar1; lVar7 = lVar7 + 1) {
        if (*(char *)((long)psVar6->ptrs[lVar7] + 0x48) == '\x01') {
          sx_fiber_stack_release((sx_fiber_stack *)((long)psVar6->ptrs[lVar7] + 8));
        }
      }
      ppsVar8 = &psVar6->next;
    }
    psVar2 = ctx->coro_pool;
    if (psVar2 != (sx_pool *)0x0) {
      if (psVar2->pages == (sx__pool_page *)0x0) {
        sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                          ,0x77,"pool->pages");
        pcVar5 = (code *)swi(3);
        (*pcVar5)();
        return;
      }
      psVar6 = psVar2->pages->next;
      while (psVar6 != (sx__pool_page *)0x0) {
        psVar4 = psVar6->next;
        (*psVar3->alloc_cb)(psVar6,0,0x10,(char *)0x0,(char *)0x0,0,psVar3->user_data);
        psVar6 = psVar4;
      }
      psVar2->capacity = 0;
      psVar6 = psVar2->pages;
      psVar6->iter = 0;
      psVar6->next = (sx__pool_page *)0x0;
      (*psVar3->alloc_cb)(psVar2,0,0x10,(char *)0x0,(char *)0x0,0,psVar3->user_data);
    }
    (*psVar3->alloc_cb)(ctx,0,0,(char *)0x0,(char *)0x0,0,psVar3->user_data);
  }
  return;
}

Assistant:

void sx_coro_destroy_context(sx_coro_context* ctx)
{
    sx_assert(ctx);

    const sx_alloc* alloc = ctx->alloc;
    if (ctx->coro_pool) {
        // TODO: release fiber's stack memory
        sx__pool_page* page = ctx->coro_pool->pages;
        int capacity = ctx->coro_pool->capacity;
        while (page) {
            for (int i = page->iter; i < capacity; i++) {
                sx__coro_state* state = page->ptrs[i];
                if (state->init) {
                    sx_fiber_stack_release(&state->stack_mem);
                }
            }
            page = page->next;
        }

        sx_pool_destroy(ctx->coro_pool, alloc);
        sx_free(alloc, ctx);
    }
}